

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuerySegment.hpp
# Opt level: O2

void __thiscall
cppjieba::QuerySegment::Cut
          (QuerySegment *this,string *sentence,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,bool hmm)

{
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> tmp;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> local_28;
  
  local_28.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Cut(this,sentence,&local_28,hmm);
  GetStringsFromWords(&local_28,words);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector(&local_28);
  return;
}

Assistant:

void Cut(const string& sentence, vector<string>& words, bool hmm) const {
    vector<Word> tmp;
    Cut(sentence, tmp, hmm);
    GetStringsFromWords(tmp, words);
  }